

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_file_system.cpp
# Opt level: O2

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::PipeFileSystem::OpenPipe
          (PipeFileSystem *this,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *handle)

{
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::PipeFile,duckdb::unique_ptr<duckdb::FileHandle,std::default_delete<duckdb::FileHandle>,true>>
            ((duckdb *)&local_18,handle);
  (this->super_FileSystem)._vptr_FileSystem = local_18;
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> PipeFileSystem::OpenPipe(unique_ptr<FileHandle> handle) {
	return make_uniq<PipeFile>(std::move(handle));
}